

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprProbability(Expr *p)

{
  char *z;
  int length;
  double local_20;
  double r;
  Expr *p_local;
  
  local_20 = -1.0;
  if (p->op == 0x84) {
    z = (p->u).zToken;
    r = (double)p;
    length = sqlite3Strlen30((p->u).zToken);
    sqlite3AtoF(z,&local_20,length,'\x01');
    if (local_20 <= 1.0) {
      p_local._4_4_ = (int)(local_20 * 134217728.0);
    }
    else {
      p_local._4_4_ = -1;
    }
  }
  else {
    p_local._4_4_ = -1;
  }
  return p_local._4_4_;
}

Assistant:

static int exprProbability(Expr *p){
  double r = -1.0;
  if( p->op!=TK_FLOAT ) return -1;
  sqlite3AtoF(p->u.zToken, &r, sqlite3Strlen30(p->u.zToken), SQLITE_UTF8);
  assert( r>=0.0 );
  if( r>1.0 ) return -1;
  return (int)(r*134217728.0);
}